

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O2

void Pf_StoCreateGate(Pf_Man_t *pMan,Mio_Cell_t *pCell,int **pComp,int **pPerm,int *pnPerms)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int Perm [6];
  
  uVar1 = *(uint *)&pCell->field_0x8;
  uVar2 = pnPerms[uVar1 >> 0x1c];
  uVar12 = uVar1;
  for (uVar7 = 0; uVar7 < uVar12 >> 0x1c; uVar7 = uVar7 + 1) {
    iVar5 = Abc_Var2Lit((int)uVar7,0);
    Perm[uVar7] = iVar5;
    uVar12 = *(uint *)&pCell->field_0x8;
  }
  uVar7 = pCell->uTruth;
  uVar13 = 0;
  uVar8 = uVar7;
  uVar10 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar10 = uVar13;
  }
  while( true ) {
    if (uVar13 == uVar10) {
      if (uVar7 != uVar8) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                      ,0xca,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)"
                     );
      }
      return;
    }
    uVar9 = uVar8;
    for (lVar11 = 0; (uint)lVar11 >> (byte)(uVar1 >> 0x1c) == 0; lVar11 = lVar11 + 1) {
      Pf_StoCreateGateAdd(pMan,uVar9,Perm,uVar12 >> 0x1c,uVar12 & 0xfffffff);
      uVar12 = *(uint *)&pCell->field_0x8;
      iVar5 = pComp[uVar12 >> 0x1c][lVar11];
      if (Perm[iVar5] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      bVar6 = (byte)(1 << ((byte)iVar5 & 0x1f));
      uVar9 = uVar9 << (bVar6 & 0x3f) & s_Truths6[iVar5] |
              (s_Truths6[iVar5] & uVar9) >> (bVar6 & 0x3f);
      Perm[iVar5] = Perm[iVar5] ^ 1;
    }
    if (uVar8 != uVar9) break;
    iVar5 = pPerm[uVar12 >> 0x1c][uVar13];
    uVar9 = s_PMasks[iVar5][0];
    uVar3 = s_PMasks[iVar5][1];
    bVar6 = (byte)(1L << ((byte)iVar5 & 0x3f));
    uVar4 = s_PMasks[iVar5][2];
    *(ulong *)(Perm + iVar5) =
         CONCAT44((int)*(undefined8 *)(Perm + iVar5),
                  (int)((ulong)*(undefined8 *)(Perm + iVar5) >> 0x20));
    uVar13 = uVar13 + 1;
    uVar8 = (uVar8 & uVar4) >> (bVar6 & 0x3f) | (uVar3 & uVar8) << (bVar6 & 0x3f) | uVar9 & uVar8;
  }
  __assert_fail("tTemp2 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                ,0xc3,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)");
}

Assistant:

void Pf_StoCreateGate( Pf_Man_t * pMan, Mio_Cell_t * pCell, int ** pComp, int ** pPerm, int * pnPerms )
{
    int Perm[PF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Pf_StoCreateGateAdd( pMan, tCur, Perm, pCell->nFanins, pCell->Id );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}